

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_3_dec_number(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_number(&G->data,PVIP_NODE_NUMBER,yytext,(long)yyleng);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_3_dec_number(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
  yyprintf((stderr, "do yy_3_dec_number"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
    yy = PVIP_node_new_number(&(G->data), PVIP_NODE_NUMBER, yytext, yyleng);\n\
}\n"));
  
    yy = PVIP_node_new_number(&(G->data), PVIP_NODE_NUMBER, yytext, yyleng);
;
}